

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsubwins.cpp
# Opt level: O0

void init_windows(void)

{
  char *local_108;
  undefined4 local_100;
  undefined4 local_f8;
  Am_Style *local_f0;
  undefined4 local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  undefined4 local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined8 local_a0;
  Am_Style *local_90;
  Am_Drawonable *local_88;
  undefined1 *local_80;
  Am_Drawonable *local_78;
  Am_Style *local_70;
  Am_Drawonable *local_68;
  undefined1 *local_60;
  Am_Drawonable *local_58;
  Am_Style *local_50;
  Am_Drawonable *local_48;
  undefined1 *local_40;
  Am_Drawonable *local_38;
  Am_Style local_30 [8];
  Am_Style local_28 [24];
  Am_Style local_10 [8];
  
  root = (Am_Drawonable *)Am_Drawonable::Get_Root_Drawonable((char *)0x0);
  local_50 = local_10;
  local_48 = root;
  Am_Style::Am_Style(local_50,(Am_Style *)&Am_No_Style);
  local_f0 = local_50;
  local_108 = "";
  local_a0 = 0;
  local_a8 = 1;
  local_b0 = 0;
  local_b8 = 0;
  local_c0 = 1;
  local_c8 = 0;
  local_d0 = 0;
  local_d8 = 1;
  local_e0 = 1;
  local_e8 = 0;
  local_f8 = 0;
  local_100 = 1;
  local_40 = (undefined1 *)&local_108;
  d1 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_48)(local_48,0x352,0xb4,0xdc,100);
  local_38 = d1;
  Am_Style::~Am_Style(local_10);
  local_68 = d1;
  local_70 = local_28;
  Am_Style::Am_Style(local_70,(Am_Style *)&Am_No_Style);
  local_f0 = local_70;
  local_108 = "D2 Icon";
  local_a0 = 0;
  local_a8 = 1;
  local_b0 = 0;
  local_b8 = 0;
  local_c0 = 1;
  local_c8 = 0;
  local_d0 = 0;
  local_d8 = 1;
  local_e0 = 1;
  local_e8 = 0;
  local_f8 = 0;
  local_100 = 1;
  local_60 = (undefined1 *)&local_108;
  d2 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_68)(local_68,0xfffffff1,0x16,0xaf,100,"D2")
  ;
  local_58 = d2;
  Am_Style::~Am_Style(local_28);
  local_88 = d2;
  local_90 = local_30;
  Am_Style::Am_Style(local_90,(Am_Style *)&Am_No_Style);
  local_f0 = local_90;
  local_108 = "";
  local_a0 = 0;
  local_a8 = 1;
  local_b0 = 0;
  local_b8 = 0;
  local_c0 = 1;
  local_c8 = 0;
  local_d0 = 0;
  local_d8 = 1;
  local_e0 = 1;
  local_e8 = 0;
  local_f8 = 0;
  local_100 = 1;
  local_80 = (undefined1 *)&local_108;
  d3 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_88)(local_88,0x1e,0x12,0x96,100);
  local_78 = d3;
  Am_Style::~Am_Style(local_30);
  return;
}

Assistant:

void
init_windows()
{
  root = Am_Drawonable::Get_Root_Drawonable();
  d1 = root->Create(850, 180, 220, 100);
  d2 = d1->Create(-15, 22, 175, 100, "D2", "D2 Icon", true, false, Am_No_Style,
                  false, 1, 1, 0, 0,
                  // want a title-bar when placed at top-level
                  true);
  d3 = d2->Create(30, 18, 150, 100);
}